

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

int cmsys::SystemTools::Stat(string *path,Stat_t *buf)

{
  ulong uVar1;
  int *piVar2;
  char *__file;
  Stat_t *buf_local;
  string *path_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __file = (char *)std::__cxx11::string::c_str();
    path_local._4_4_ = stat(__file,(stat *)buf);
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 2;
    path_local._4_4_ = -1;
  }
  return path_local._4_4_;
}

Assistant:

int SystemTools::Stat(const std::string& path, SystemTools::Stat_t* buf)
{
  if (path.empty()) {
    errno = ENOENT;
    return -1;
  }
#if defined(_WIN32) && !defined(__CYGWIN__)
  // Ideally we should use Encoding::ToWindowsExtendedPath to support
  // long paths, but _wstat64 rejects paths with '?' in them, thinking
  // they are wildcards.
  std::wstring const& wpath = Encoding::ToWide(path);
#  if defined(__BORLANDC__)
  return _wstati64(wpath.c_str(), buf);
#  else
  return _wstat64(wpath.c_str(), buf);
#  endif
#else
  return stat(path.c_str(), buf);
#endif
}